

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_direct.cpp
# Opt level: O2

void __thiscall direct_solvers::SetUp(direct_solvers *this)

{
  Solver_Config config;
  undefined1 auVar1 [40];
  Solver_Config config_00;
  uint uVar2;
  uint uStack_44;
  
  uVar2 = uStack_44;
  uStack_44 = uStack_44 & 0xffffff00;
  auVar1 = ZEXT1640(CONCAT88(0x3db0000000000000,(ulong)uStack_44 << 0x20));
  config.SOR_relaxation = 1.5;
  config.type = auVar1._0_4_;
  config.pivot = (bool)auVar1[4];
  config._5_3_ = auVar1._5_3_;
  config.factor_tolerance = (Scalar)auVar1._8_8_;
  config.minimum_iterations = auVar1._16_8_;
  config.maximum_iterations = auVar1._24_8_;
  config.convergence_tolerance = (Scalar)auVar1._32_8_;
  Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::initialise_solver
            (&this->lu_solver,config);
  uStack_44 = CONCAT31(SUB43(uVar2,1),1);
  auVar1 = ZEXT1640(CONCAT88(0x3db0000000000000,(ulong)uStack_44 << 0x20));
  config_00.SOR_relaxation = 1.5;
  config_00.type = auVar1._0_4_;
  config_00.pivot = (bool)auVar1[4];
  config_00._5_3_ = auVar1._5_3_;
  config_00.factor_tolerance = (Scalar)auVar1._8_8_;
  config_00.minimum_iterations = auVar1._16_8_;
  config_00.maximum_iterations = auVar1._24_8_;
  config_00.convergence_tolerance = (Scalar)auVar1._32_8_;
  Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::initialise_solver
            (&this->lup_solver,config_00);
  return;
}

Assistant:

void SetUp() override {
    Solver_Config data;
    data.type = Solver_Type::lower_upper_factorisation;
    data.pivot = false;
    lu_solver.initialise(data);
    data.pivot = true;
    lup_solver.initialise(data);
  }